

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsModelUtils.cpp
# Opt level: O0

string * utilBasisValidityToString_abi_cxx11_(HighsInt basis_validity)

{
  int in_ESI;
  string *in_RDI;
  allocator local_1d [16];
  allocator local_d [13];
  
  if (in_ESI == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Not valid",local_1d);
    std::allocator<char>::~allocator((allocator<char> *)local_1d);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Valid",local_d);
    std::allocator<char>::~allocator((allocator<char> *)local_d);
  }
  return in_RDI;
}

Assistant:

std::string utilBasisValidityToString(const HighsInt basis_validity) {
  if (basis_validity) {
    return "Valid";
  } else {
    return "Not valid";
  }
}